

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall BpTree<int>::Coalesce(BpTree<int> *this,IndexNode<int> *C,IndexNode<int> *D,int k2)

{
  pointer pcVar1;
  Addr p;
  pointer pAVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  IndexNode<int> E;
  IndexNode<int> P;
  IndexNode<int> local_270;
  IndexNode<int> local_210;
  IndexNode<int> local_1b0;
  IndexNode<int> local_150;
  IndexNode<int> local_f0;
  IndexNode<int> local_90;
  
  IndexNode<int>::IndexNode(&local_150,C);
  Buffer::Lock(&blocks,local_150.self.BlockNum);
  IndexNode<int>::~IndexNode(&local_150);
  IndexNode<int>::IndexNode(&local_1b0,D);
  Buffer::Lock(&blocks,local_1b0.self.BlockNum);
  IndexNode<int>::~IndexNode(&local_1b0);
  IndexNode<int>::IndexNode(&E,this->N);
  IndexNode<int>::IndexNode(&P,this->N);
  IndexNode<int>::IndexNode(&local_90,C);
  IndexNode<int>::~IndexNode(&local_90);
  uVar4 = 1;
  if (1 < this->N) {
    uVar4 = (ulong)(uint)this->N;
  }
  uVar3 = (ulong)((int)uVar4 - 1);
  pcVar1 = (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_90.NodeState == '1') {
    for (uVar4 = 0; (uVar5 = uVar3, uVar3 != uVar4 && (uVar5 = uVar4, pcVar1[uVar4] == '1'));
        uVar4 = uVar4 + 1) {
    }
    for (lVar6 = 0;
        (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar6] == '1'; lVar6 = lVar6 + 1) {
      (D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar5 + lVar6] =
           (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar6];
      (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5 + lVar6] =
           (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar6];
      (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6 + uVar5] =
           (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar6];
    }
    (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
    [(long)this->N + -1] =
         (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
         _M_start[(long)this->N + -1];
  }
  else {
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      if (pcVar1[uVar5] != '1') {
        uVar4 = (ulong)((int)uVar5 + 1);
        uVar3 = uVar5;
        break;
      }
    }
    (D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar3] = k2;
    pcVar1[uVar3] = '1';
    for (lVar6 = 0;
        (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar6] == '1'; lVar6 = lVar6 + 1) {
      (D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar4 + lVar6] =
           (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar6];
      (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4 + lVar6] =
           (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar6];
      (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6 + uVar4] =
           (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar6];
    }
    (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
    [(uint)((int)uVar4 + (int)lVar6)] =
         (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar6];
    for (lVar6 = 0;
        (lVar6 < this->N &&
        (pAVar2 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start, pAVar2[lVar6].FileOff != -1)); lVar6 = lVar6 + 1
        ) {
      FindNode(this,pAVar2[lVar6],&E);
      E.parent = D->self;
      IndexNode<int>::IndexNode(&local_f0,&E);
      UpdateBlock(this,&local_f0);
      IndexNode<int>::~IndexNode(&local_f0);
    }
  }
  IndexNode<int>::IndexNode(&local_210,C);
  UpdateBlock(this,&local_210);
  IndexNode<int>::~IndexNode(&local_210);
  IndexNode<int>::IndexNode(&local_270,D);
  UpdateBlock(this,&local_270);
  IndexNode<int>::~IndexNode(&local_270);
  p = C->self;
  FindNode(this,C->parent,&P);
  Delete_Aux(this,&P,k2,C->self);
  FindNode(this,p,&E);
  DeleteNode(this,&E);
  IndexNode<int>::~IndexNode(&P);
  IndexNode<int>::~IndexNode(&E);
  return;
}

Assistant:

void BpTree<K>::Coalesce(IndexNode<K>& C, IndexNode<K>& D, K k2) {
	this->LockNode(C);
	this->LockNode(D);
	IndexNode<K> E(N);
	IndexNode<K> P(N);
	int m, pos;
	if (!this->IsLeaf(C)) {
		//��Ҷ�ڵ�֮��ĺϲ�
		for (pos = 0; pos < N - 1 && D.v[pos] == '1'; pos++);	//D.k[pos]�ǿյģ�D.p[pos+1]�ǿյ�
		D.k[pos] = k2;
		D.v[pos] = '1';
		pos++;
		for (m = 0; C.v[m] == '1'; m++) {
			D.k[pos + m] = C.k[m];
			D.p[pos + m] = C.p[m];
			D.v[pos + m] = C.v[m];
		}
		D.p[pos + m] = C.p[m];
		for (m = 0; m < N && C.p[m].FileOff != -1; m++) {
			this->FindNode(C.p[m], E);
			E.parent = D.self;
			this->UpdateBlock(E);
		}
	}
	else {
		//Ҷ�ڵ�֮��ĺϲ�
		for (pos = 0; pos < N - 1 && D.v[pos] == '1'; pos++);	//D.k[pos]�ǿյģ�D.p[pos]�ǿյ�
		for (m = 0; C.v[m] == '1'; m++) {
			D.k[pos + m] = C.k[m];
			D.p[pos + m] = C.p[m];
			D.v[pos + m] = C.v[m];
		}
		D.p[N - 1] = C.p[N - 1];
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	Addr temp_p = C.self;
	this->FindNode(C.parent, P);
	this->Delete_Aux(P, k2, C.self);
	this->FindNode(temp_p, E);
	this->DeleteNode(E);
	return;
}